

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O0

VerifyError * __thiscall
bssl::CertPathBuilderResultPath::GetVerifyError
          (VerifyError *__return_storage_ptr__,CertPathBuilderResultPath *this)

{
  undefined8 uVar1;
  bool bVar2;
  StatusCode code;
  ParsedCertificate *pPVar3;
  void **ppvVar4;
  optional<const_void_*> oVar5;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  _Storage<const_void_*,_true> local_128;
  optional<const_void_*> single_error;
  ptrdiff_t depth;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined4 local_6c;
  string local_68;
  undefined1 local_38 [8];
  string diagnostic;
  CertPathBuilderResultPath *this_local;
  
  diagnostic.field_2._8_8_ = this;
  CertPathErrors::ToDebugString_abi_cxx11_((string *)local_38,&this->errors,&this->certs);
  bVar2 = CertPathErrors::ContainsHighSeverityErrors(&this->errors);
  if (bVar2) {
    bVar2 = CertPathErrors::ContainsError(&this->errors,"Internal error");
    if (!bVar2) {
      bVar2 = CertPathErrors::ContainsError(&this->errors,"Chain is empty");
      if (!bVar2) {
        bVar2 = CertPathErrors::ContainsError(&this->errors,"Deadline exceeded");
        if (bVar2) {
          ::std::__cxx11::string::string((string *)&local_d0,(string *)local_38);
          VerifyError::VerifyError(__return_storage_ptr__,PATH_DEADLINE_EXCEEDED,-1,&local_d0);
          ::std::__cxx11::string::~string((string *)&local_d0);
        }
        else {
          bVar2 = CertPathErrors::ContainsError(&this->errors,"Iteration limit exceeded");
          if (bVar2) {
            ::std::__cxx11::string::string((string *)&local_f0,(string *)local_38);
            VerifyError::VerifyError
                      (__return_storage_ptr__,PATH_ITERATION_COUNT_EXCEEDED,-1,&local_f0);
            ::std::__cxx11::string::~string((string *)&local_f0);
          }
          else {
            bVar2 = CertPathErrors::ContainsError(&this->errors,"Depth limit exceeded");
            if (bVar2) {
              ::std::__cxx11::string::string((string *)&depth,(string *)local_38);
              VerifyError::VerifyError
                        (__return_storage_ptr__,PATH_DEPTH_LIMIT_REACHED,-1,(string *)&depth);
              ::std::__cxx11::string::~string((string *)&depth);
            }
            else {
              single_error.super__Optional_base<const_void_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_void_*>._M_engaged = true;
              single_error.super__Optional_base<const_void_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_void_*>._9_7_ = 0xffffffffffffff;
              oVar5 = CertPathErrors::FindSingleHighSeverityError
                                (&this->errors,
                                 (ptrdiff_t *)
                                 &single_error.super__Optional_base<const_void_*,_true,_true>.
                                  _M_payload.super__Optional_payload_base<const_void_*>._M_engaged);
              local_128 = oVar5.super__Optional_base<const_void_*,_true,_true>._M_payload.
                          super__Optional_payload_base<const_void_*>._M_payload;
              single_error.super__Optional_base<const_void_*,_true,_true>._M_payload.
              super__Optional_payload_base<const_void_*>._M_payload._0_1_ =
                   oVar5.super__Optional_base<const_void_*,_true,_true>._M_payload.
                   super__Optional_payload_base<const_void_*>._M_engaged;
              bVar2 = ::std::optional<const_void_*>::has_value((optional<const_void_*> *)&local_128)
              ;
              if (bVar2) {
                ppvVar4 = ::std::optional<const_void_*>::value((optional<const_void_*> *)&local_128)
                ;
                uVar1 = single_error.super__Optional_base<const_void_*,_true,_true>._M_payload.
                        super__Optional_payload_base<const_void_*>._8_8_;
                if ((char *)*ppvVar4 == "Time is after notAfter") {
                  ::std::__cxx11::string::string((string *)&local_168,(string *)local_38);
                  VerifyError::VerifyError
                            (__return_storage_ptr__,CERTIFICATE_EXPIRED,uVar1,&local_168);
                  ::std::__cxx11::string::~string((string *)&local_168);
                }
                else {
                  ppvVar4 = ::std::optional<const_void_*>::value
                                      ((optional<const_void_*> *)&local_128);
                  uVar1 = single_error.super__Optional_base<const_void_*,_true,_true>._M_payload.
                          super__Optional_payload_base<const_void_*>._8_8_;
                  if ((char *)*ppvVar4 == "Time is before notBefore") {
                    ::std::__cxx11::string::string((string *)&local_188,(string *)local_38);
                    VerifyError::VerifyError
                              (__return_storage_ptr__,CERTIFICATE_NOT_YET_VALID,uVar1,&local_188);
                    ::std::__cxx11::string::~string((string *)&local_188);
                  }
                  else {
                    ppvVar4 = ::std::optional<const_void_*>::value
                                        ((optional<const_void_*> *)&local_128);
                    if ((char *)*ppvVar4 != "Distrusted by trust store") {
                      ppvVar4 = ::std::optional<const_void_*>::value
                                          ((optional<const_void_*> *)&local_128);
                      if ((char *)*ppvVar4 != "Certificate is not a trust anchor") {
                        ppvVar4 = ::std::optional<const_void_*>::value
                                            ((optional<const_void_*> *)&local_128);
                        if ((char *)*ppvVar4 != "max_path_length reached") {
                          ppvVar4 = ::std::optional<const_void_*>::value
                                              ((optional<const_void_*> *)&local_128);
                          if ((char *)*ppvVar4 != "subject does not match issuer") {
                            ppvVar4 = ::std::optional<const_void_*>::value
                                                ((optional<const_void_*> *)&local_128);
                            if ((char *)*ppvVar4 != "No matching issuer found") {
                              ppvVar4 = ::std::optional<const_void_*>::value
                                                  ((optional<const_void_*> *)&local_128);
                              uVar1 = single_error.super__Optional_base<const_void_*,_true,_true>.
                                      _M_payload.super__Optional_payload_base<const_void_*>._8_8_;
                              if ((char *)*ppvVar4 == "VerifySignedData failed") {
                                ::std::__cxx11::string::string
                                          ((string *)&local_1c8,(string *)local_38);
                                VerifyError::VerifyError
                                          (__return_storage_ptr__,CERTIFICATE_INVALID_SIGNATURE,
                                           uVar1,&local_1c8);
                                ::std::__cxx11::string::~string((string *)&local_1c8);
                              }
                              else {
                                ppvVar4 = ::std::optional<const_void_*>::value
                                                    ((optional<const_void_*> *)&local_128);
                                uVar1 = single_error.super__Optional_base<const_void_*,_true,_true>.
                                        _M_payload.super__Optional_payload_base<const_void_*>._8_8_;
                                if ((char *)*ppvVar4 == "Unacceptable signature algorithm") {
                                  ::std::__cxx11::string::string
                                            ((string *)&local_1e8,(string *)local_38);
                                  VerifyError::VerifyError
                                            (__return_storage_ptr__,
                                             CERTIFICATE_UNSUPPORTED_SIGNATURE_ALGORITHM,uVar1,
                                             &local_1e8);
                                  ::std::__cxx11::string::~string((string *)&local_1e8);
                                }
                                else {
                                  ppvVar4 = ::std::optional<const_void_*>::value
                                                      ((optional<const_void_*> *)&local_128);
                                  uVar1 = single_error.
                                          super__Optional_base<const_void_*,_true,_true>._M_payload.
                                          super__Optional_payload_base<const_void_*>._8_8_;
                                  if ((char *)*ppvVar4 == "Unacceptable public key") {
                                    ::std::__cxx11::string::string
                                              ((string *)&local_208,(string *)local_38);
                                    VerifyError::VerifyError
                                              (__return_storage_ptr__,CERTIFICATE_UNSUPPORTED_KEY,
                                               uVar1,&local_208);
                                    ::std::__cxx11::string::~string((string *)&local_208);
                                  }
                                  else {
                                    ppvVar4 = ::std::optional<const_void_*>::value
                                                        ((optional<const_void_*> *)&local_128);
                                    if ((char *)*ppvVar4 !=
                                        "The extended key usage does not include server auth") {
                                      ppvVar4 = ::std::optional<const_void_*>::value
                                                          ((optional<const_void_*> *)&local_128);
                                      if ((char *)*ppvVar4 !=
                                          "The extended key usage does not include server auth but instead includes anyExtendeKeyUsage"
                                         ) {
                                        ppvVar4 = ::std::optional<const_void_*>::value
                                                            ((optional<const_void_*> *)&local_128);
                                        if ((char *)*ppvVar4 !=
                                            "The extended key usage does not include client auth") {
                                          ppvVar4 = ::std::optional<const_void_*>::value
                                                              ((optional<const_void_*> *)&local_128)
                                          ;
                                          if ((char *)*ppvVar4 !=
                                              "The extended key usage does not include client auth but instead includes anyExtendedKeyUsage"
                                             ) {
                                            ppvVar4 = ::std::optional<const_void_*>::value
                                                                ((optional<const_void_*> *)
                                                                 &local_128);
                                            if ((char *)*ppvVar4 !=
                                                "The extended key usage does not include client auth or server auth"
                                               ) {
                                              ppvVar4 = ::std::optional<const_void_*>::value
                                                                  ((optional<const_void_*> *)
                                                                   &local_128);
                                              uVar1 = single_error.
                                                      super__Optional_base<const_void_*,_true,_true>
                                                      ._M_payload.
                                                      super__Optional_payload_base<const_void_*>.
                                                      _8_8_;
                                              if ((char *)*ppvVar4 == "Certificate is revoked") {
                                                ::std::__cxx11::string::string
                                                          ((string *)&local_248,(string *)local_38);
                                                VerifyError::VerifyError
                                                          (__return_storage_ptr__,
                                                           CERTIFICATE_REVOKED,uVar1,&local_248);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_248);
                                              }
                                              else {
                                                ppvVar4 = ::std::optional<const_void_*>::value
                                                                    ((optional<const_void_*> *)
                                                                     &local_128);
                                                uVar1 = single_error.
                                                                                                                
                                                  super__Optional_base<const_void_*,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<const_void_*>._8_8_;
                                                if ((char *)*ppvVar4 ==
                                                    "Certificate lacks a revocation mechanism") {
                                                  ::std::__cxx11::string::string
                                                            ((string *)&local_268,(string *)local_38
                                                            );
                                                  VerifyError::VerifyError
                                                            (__return_storage_ptr__,
                                                             CERTIFICATE_NO_REVOCATION_MECHANISM,
                                                             uVar1,&local_268);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_268);
                                                }
                                                else {
                                                  ppvVar4 = ::std::optional<const_void_*>::value
                                                                      ((optional<const_void_*> *)
                                                                       &local_128);
                                                  uVar1 = single_error.
                                                                                                                    
                                                  super__Optional_base<const_void_*,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<const_void_*>._8_8_;
                                                  if ((char *)*ppvVar4 ==
                                                      "Unable to check revocation") {
                                                    ::std::__cxx11::string::string
                                                              ((string *)&local_288,
                                                               (string *)local_38);
                                                    VerifyError::VerifyError
                                                              (__return_storage_ptr__,
                                                                                                                              
                                                  CERTIFICATE_UNABLE_TO_CHECK_REVOCATION,uVar1,
                                                  &local_288);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_288);
                                                  }
                                                  else {
                                                    code = CERTIFICATE_INVALID;
                                                    if ((long)single_error.
                                                                                                                            
                                                  super__Optional_base<const_void_*,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<const_void_*>._8_8_ <
                                                  0) {
                                                    code = VERIFICATION_FAILURE;
                                                  }
                                                  ::std::__cxx11::string::string
                                                            ((string *)&local_2a8,(string *)local_38
                                                            );
                                                  VerifyError::VerifyError
                                                            (__return_storage_ptr__,code,uVar1,
                                                             &local_2a8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_2a8);
                                                  }
                                                }
                                              }
                                              goto LAB_005f8fe8;
                                            }
                                          }
                                        }
                                      }
                                    }
                                    uVar1 = single_error.
                                            super__Optional_base<const_void_*,_true,_true>.
                                            _M_payload.super__Optional_payload_base<const_void_*>.
                                            _8_8_;
                                    ::std::__cxx11::string::string
                                              ((string *)&local_228,(string *)local_38);
                                    VerifyError::VerifyError
                                              (__return_storage_ptr__,CERTIFICATE_NO_MATCHING_EKU,
                                               uVar1,&local_228);
                                    ::std::__cxx11::string::~string((string *)&local_228);
                                  }
                                }
                              }
                              goto LAB_005f8fe8;
                            }
                          }
                        }
                      }
                    }
                    uVar1 = single_error.super__Optional_base<const_void_*,_true,_true>._M_payload.
                            super__Optional_payload_base<const_void_*>._8_8_;
                    ::std::__cxx11::string::string((string *)&local_1a8,(string *)local_38);
                    VerifyError::VerifyError(__return_storage_ptr__,PATH_NOT_FOUND,uVar1,&local_1a8)
                    ;
                    ::std::__cxx11::string::~string((string *)&local_1a8);
                  }
                }
              }
              else {
                ::std::__cxx11::string::string((string *)&local_148,(string *)local_38);
                VerifyError::VerifyError(__return_storage_ptr__,PATH_MULTIPLE_ERRORS,-1,&local_148);
                ::std::__cxx11::string::~string((string *)&local_148);
              }
            }
          }
        }
        goto LAB_005f8fe8;
      }
    }
    ::std::__cxx11::string::string((string *)&local_b0,(string *)local_38);
    VerifyError::VerifyError(__return_storage_ptr__,VERIFICATION_FAILURE,-1,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    pPVar3 = GetTrustedCert(this);
    if (pPVar3 == (ParsedCertificate *)0x0) {
      ::std::__cxx11::string::string((string *)&local_90,(string *)local_38);
      VerifyError::VerifyError(__return_storage_ptr__,VERIFICATION_FAILURE,-1,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      ::std::__cxx11::string::string((string *)&local_68,(string *)local_38);
      VerifyError::VerifyError(__return_storage_ptr__,PATH_VERIFIED,0,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
    }
  }
LAB_005f8fe8:
  local_6c = 1;
  ::std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

VerifyError CertPathBuilderResultPath::GetVerifyError() const {
  // Diagnostic string is always "everything" about the path.
  std::string diagnostic = errors.ToDebugString(certs);
  if (!errors.ContainsHighSeverityErrors()) {
    // TODO(bbe3): Having to check this after seems awkward: crbug.com/boringssl/713
    if (GetTrustedCert()) {
      return VerifyError(VerifyError::StatusCode::PATH_VERIFIED, 0,
                         std::move(diagnostic));
    } else {
      return VerifyError(VerifyError::StatusCode::VERIFICATION_FAILURE, -1,
                         std::move(diagnostic));
    }
  }

  // Check for the presence of things that amount to Internal errors in the
  // verification code. We deliberately prioritize this to not hide it in
  // multiple error cases.
  if (errors.ContainsError(cert_errors::kInternalError) ||
      errors.ContainsError(cert_errors::kChainIsEmpty)) {
    return VerifyError(VerifyError::StatusCode::VERIFICATION_FAILURE, -1,
                       std::move(diagnostic));
  }

  // Similarly, for the deadline and limit cases, there will often be other
  // errors that we probably do not care about, since path building was
  // aborted. Surface these errors instead of having them hidden in the multiple
  // error case.
  //
  // Normally callers should check for these in the path builder result before
  // calling this on a single path, but this is here in case they do not and
  // these errors are actually present on this path.
  if (errors.ContainsError(cert_errors::kDeadlineExceeded)) {
    return VerifyError(VerifyError::StatusCode::PATH_DEADLINE_EXCEEDED, -1,
                       std::move(diagnostic));
  }
  if (errors.ContainsError(cert_errors::kIterationLimitExceeded)) {
    return VerifyError(VerifyError::StatusCode::PATH_ITERATION_COUNT_EXCEEDED,
                       -1, std::move(diagnostic));
  }
  if (errors.ContainsError(cert_errors::kDepthLimitExceeded)) {
    return VerifyError(VerifyError::StatusCode::PATH_DEPTH_LIMIT_REACHED, -1,
                       std::move(diagnostic));
  }

  // If the chain has multiple high severity errors, indicate that.
  ptrdiff_t depth = -1;
  std::optional<CertErrorId> single_error =
      errors.FindSingleHighSeverityError(depth);
  if (!single_error.has_value()) {
    return VerifyError(VerifyError::StatusCode::PATH_MULTIPLE_ERRORS, -1,
                       std::move(diagnostic));
  }

  // Otherwise it has a single error, map it appropriately at the
  // depth it first occurs.
  if (single_error.value() == cert_errors::kValidityFailedNotAfter) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_EXPIRED, depth,
                       std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kValidityFailedNotBefore) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_NOT_YET_VALID,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kDistrustedByTrustStore ||
      single_error.value() == cert_errors::kCertIsNotTrustAnchor ||
      single_error.value() == cert_errors::kMaxPathLengthViolated ||
      single_error.value() == cert_errors::kSubjectDoesNotMatchIssuer ||
      single_error.value() == cert_errors::kNoIssuersFound) {
    return VerifyError(VerifyError::StatusCode::PATH_NOT_FOUND, depth,
                       std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kVerifySignedDataFailed) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_INVALID_SIGNATURE,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kUnacceptableSignatureAlgorithm) {
    return VerifyError(
        VerifyError::StatusCode::CERTIFICATE_UNSUPPORTED_SIGNATURE_ALGORITHM,
        depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kUnacceptablePublicKey) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_UNSUPPORTED_KEY,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kEkuLacksServerAuth ||
      single_error.value() == cert_errors::kEkuLacksServerAuthButHasAnyEKU ||
      single_error.value() == cert_errors::kEkuLacksClientAuth ||
      single_error.value() == cert_errors::kEkuLacksClientAuthButHasAnyEKU ||
      single_error.value() == cert_errors::kEkuLacksClientAuthOrServerAuth) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_NO_MATCHING_EKU,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kCertificateRevoked) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_REVOKED, depth,
                       std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kNoRevocationMechanism) {
    return VerifyError(
        VerifyError::StatusCode::CERTIFICATE_NO_REVOCATION_MECHANISM, depth,
        std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kUnableToCheckRevocation) {
    return VerifyError(
        VerifyError::StatusCode::CERTIFICATE_UNABLE_TO_CHECK_REVOCATION, depth,
        std::move(diagnostic));
  }
  // All other High severity errors map to CERTIFICATE_INVALID if associated
  // to a certificate, or VERIFICATION_FAILURE if not associated to a
  // certificate.
  return VerifyError((depth < 0) ? VerifyError::StatusCode::VERIFICATION_FAILURE
                                 : VerifyError::StatusCode::CERTIFICATE_INVALID,
                     depth, std::move(diagnostic));
}